

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.cpp
# Opt level: O3

Variable __thiscall LiteScript::_Type_ARRAY::Convert(_Type_ARRAY *this,Variable *object,Type *type)

{
  Array *obj;
  bool bVar1;
  Object *pOVar2;
  Type *in_RCX;
  uint *extraout_RDX;
  uint *extraout_RDX_00;
  uint *extraout_RDX_01;
  uint *extraout_RDX_02;
  Variable VVar4;
  string local_70;
  String local_50;
  uint *puVar3;
  
  bVar1 = Type::operator==(in_RCX,(Type *)_type_string);
  if (bVar1) {
    pOVar2 = Variable::operator->((Variable *)type);
    Memory::Create((Memory *)this,(Type *)pOVar2->memory);
    (*(code *)object->obj[7].data)(&local_70,object,type);
    String::String(&local_50,&local_70);
    pOVar2 = Variable::operator->((Variable *)this);
    String::operator=((String *)pOVar2->data,&local_50);
    puVar3 = extraout_RDX;
    if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
         *)local_50.str._M_dataplus._M_p != &local_50.str.field_2) {
      operator_delete(local_50.str._M_dataplus._M_p);
      puVar3 = extraout_RDX_00;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
      puVar3 = extraout_RDX_01;
    }
  }
  else {
    bVar1 = Type::operator==(in_RCX,(Type *)_type_array);
    pOVar2 = Variable::operator->((Variable *)type);
    if (bVar1) {
      Memory::Create((Memory *)this,(Type *)pOVar2->memory);
      pOVar2 = Variable::operator->((Variable *)type);
      obj = (Array *)pOVar2->data;
      pOVar2 = Variable::operator->((Variable *)this);
      Array::operator=((Array *)pOVar2->data,obj);
      puVar3 = extraout_RDX_02;
    }
    else {
      VVar4 = Memory::Create((Memory *)this,(Type *)pOVar2->memory);
      puVar3 = VVar4.nb_ref;
    }
  }
  VVar4.nb_ref = puVar3;
  VVar4.obj = (Object *)this;
  return VVar4;
}

Assistant:

LiteScript::Variable LiteScript::_Type_ARRAY::Convert(const Variable &object, const Type &type) const {
    if (type == Type::STRING) {
        Variable result = object->memory.Create(Type::STRING);
        result->GetData<String>() = String(this->ToString(object));
        return result;
    }
    else if (type == Type::ARRAY) {
        Variable result = object->memory.Create(Type::ARRAY);
        result->GetData<Array>() = object->GetData<Array>();
        return result;
    }
    else {
        return object->memory.Create(Type::NIL);
    }
}